

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

char * private_RemoveWhiteSpace<true>(json_string *value_t,bool escapeQuotes,size_t *len)

{
  long lVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  byte local_52;
  byte *local_40;
  char *p;
  char *end;
  char *runner;
  char *result;
  size_t *len_local;
  json_string *pjStack_10;
  bool escapeQuotes_local;
  json_string *value_t_local;
  
  result = (char *)len;
  len_local._7_1_ = escapeQuotes;
  pjStack_10 = value_t;
  lVar1 = std::__cxx11::string::length();
  end = json_malloc<char>(lVar1 + 1);
  runner = end;
  lVar1 = std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::length();
  p = (char *)(lVar1 + lVar2);
  local_40 = (byte *)std::__cxx11::string::data();
  do {
    if (local_40 == (byte *)p) {
LAB_001fe631:
      *(long *)result = (long)end - (long)runner;
      return runner;
    }
    pbVar4 = local_40;
    switch(*local_40) {
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      break;
    default:
      goto switchD_001fe42f_caseD_b;
    case 0x22:
      *end = '\"';
      end = end + 1;
      while (pbVar4 = local_40 + 1, local_40[1] != 0x22) {
        if (pbVar4 == (byte *)p) goto LAB_001fe631;
        if (*pbVar4 == 0x5c) {
          pbVar4 = (byte *)(end + 1);
          *end = '\\';
          if ((len_local._7_1_ & 1) == 0) {
            end = end + 2;
            *pbVar4 = local_40[2];
            local_40 = local_40 + 2;
          }
          else {
            pbVar3 = local_40 + 2;
            end = (char *)pbVar4;
            if (local_40[2] == 0x22) {
              local_40 = pbVar3;
              local_52 = ascii_one();
            }
            else {
              local_52 = *pbVar3;
              local_40 = pbVar3;
            }
            *end = local_52;
            end = end + 1;
          }
        }
        else {
          *end = *pbVar4;
          local_40 = pbVar4;
          end = end + 1;
        }
      }
switchD_001fe42f_caseD_b:
      local_40 = pbVar4;
      if ((*local_40 < 0x20) || (0x7e < *local_40)) goto LAB_001fe631;
      *end = *local_40;
      end = end + 1;
      break;
    case 0x23:
switchD_001fe42f_caseD_23:
      SingleLineComment((char **)&local_40,p);
      break;
    case 0x2f:
      pbVar3 = local_40 + 1;
      pbVar4 = local_40 + 1;
      local_40 = pbVar3;
      if (*pbVar4 != 0x2a) {
        if (*pbVar3 == 0x2f) goto switchD_001fe42f_caseD_23;
        goto LAB_001fe631;
      }
      while( true ) {
        pbVar4 = local_40 + 1;
        bVar5 = true;
        if (local_40[1] == 0x2a) {
          bVar5 = local_40[2] != 0x2f;
        }
        if (!bVar5) break;
        if (pbVar4 == (byte *)p) goto LAB_001fe631;
        *end = *pbVar4;
        local_40 = pbVar4;
        end = end + 1;
      }
      local_40 = local_40 + 2;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

json_char * private_RemoveWhiteSpace(const json_string & value_t, bool escapeQuotes, size_t & len) json_nothrow {
#endif
	json_char * result;
	json_char * runner = result = json_malloc<json_char>(value_t.length() + 1);  //dealing with raw memory is faster than adding to a json_string
	JSON_ASSERT(result != 0, json_global(ERROR_OUT_OF_MEMORY));
	const json_char * const end = value_t.data() + value_t.length();
	for(const json_char * p = value_t.data(); p != end; ++p){
	  switch(*p){
		 case JSON_TEXT(' '):   //defined as white space
		 case JSON_TEXT('\t'):  //defined as white space
		 case JSON_TEXT('\n'):  //defined as white space
		 case JSON_TEXT('\r'):  //defined as white space
			break;
		#ifndef JSON_STRICT
			case JSON_TEXT('/'):  //a C comment
				if (*(++p) == JSON_TEXT('*')){  //a multiline comment
				   if (T) COMMENT_DELIMITER();
				   while ((*(++p) != JSON_TEXT('*')) || (*(p + 1) != JSON_TEXT('/'))){
					  if(p == end){
							COMMENT_DELIMITER(); 
							goto endofrunner;
						}
					  if (T) *runner++ = *p;
				   }
				   ++p;
				   if (T) COMMENT_DELIMITER();
				   break;
				}
				//Should be a single line C comment, so let it fall through to use the bash comment stripper
				JSON_ASSERT_SAFE(*p == JSON_TEXT('/'), JSON_TEXT("stray / character, not quoted, or a comment"), goto endofrunner;);
			case JSON_TEXT('#'):  //a bash comment
				if (T){
					SingleLineComment(p, end AND_RUNNER);
				} else {
					SingleLineComment(p, end);
				}
				break;
		 #endif
		 case JSON_TEXT('\"'):  //a quote
			*runner++ = JSON_TEXT('\"');
			while(*(++p) != JSON_TEXT('\"')){  //find the end of the quotation, as white space is preserved within it
				if(p == end) goto endofrunner;
				switch(*p){
				   case JSON_TEXT('\\'):
					  *runner++ = JSON_TEXT('\\');
					  if (escapeQuotes){
							*runner++ = (*++p == JSON_TEXT('\"')) ? ascii_one() : *p;  //an escaped quote will reak havoc will all of my searching functions, so change it into an illegal character in JSON for convertion later on
					  } else {
							*runner++ = *++p;
					  }
					  break;
				   default:
					  *runner++ = *p;
					  break;
				}
			}
			//no break, let it fall through so that the trailing quote gets added
		 default:
			JSON_ASSERT_SAFE((json_uchar)*p >= 32, JSON_TEXT("Invalid JSON character detected (lo)"), goto endofrunner;);
			JSON_ASSERT_SAFE((json_uchar)*p <= 126, JSON_TEXT("Invalid JSON character detected (hi)"), goto endofrunner;);
			*runner++ = *p;
			break;
	  }
	}
	endofrunner:
	len = runner - result;
	return result;
}